

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-h2-proxy.c
# Opt level: O0

ssize_t cf_h2_proxy_recv(Curl_cfilter *cf,Curl_easy *data,char *buf,size_t len,CURLcode *err)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  _Bool _Var3;
  CURLcode CVar4;
  CURLcode result;
  cf_call_data save;
  ssize_t nread;
  cf_h2_proxy_ctx *ctx;
  CURLcode *err_local;
  size_t len_local;
  char *buf_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  puVar1 = (undefined8 *)cf->ctx;
  save.data = (Curl_easy *)0xffffffffffffffff;
  if (*(int *)(puVar1 + 0x26) != 3) {
    *err = CURLE_RECV_ERROR;
    return -1;
  }
  uVar2 = *(undefined8 *)((long)cf->ctx + 8);
  *(Curl_easy **)((long)cf->ctx + 8) = data;
  _Var3 = Curl_bufq_is_empty((bufq *)(puVar1 + 0x13));
  if (_Var3) {
    CVar4 = proxy_h2_progress_ingress(cf,data);
    *err = CVar4;
    if (*err != CURLE_OK) goto LAB_00c20e90;
  }
  save.data = (Curl_easy *)tunnel_recv(cf,data,buf,len,err);
  if (0 < (long)save.data) {
    if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0)) &&
        (cf != (Curl_cfilter *)0x0)) && (0 < cf->cft->log_level)) {
      Curl_trc_cf_infof(data,cf,"[%d] increase window by %zd",(ulong)*(uint *)(puVar1 + 0x24),
                        save.data);
    }
    nghttp2_session_consume
              ((nghttp2_session *)*puVar1,*(int32_t *)(puVar1 + 0x24),(size_t)save.data);
  }
  CVar4 = proxy_h2_progress_egress(cf,data);
  if (CVar4 == CURLE_AGAIN) {
    if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0)) &&
       ((cf != (Curl_cfilter *)0x0 && (0 < cf->cft->log_level)))) {
      Curl_trc_cf_infof(data,cf,"[%d] egress blocked, DRAIN",(ulong)*(uint *)(puVar1 + 0x24));
    }
    drain_tunnel(cf,data,(tunnel_stream *)(puVar1 + 0x12));
  }
  else if (CVar4 != CURLE_OK) {
    *err = CVar4;
    save.data = (Curl_easy *)0xffffffffffffffff;
  }
LAB_00c20e90:
  _Var3 = Curl_bufq_is_empty((bufq *)(puVar1 + 0x13));
  if ((!_Var3) && ((-1 < (long)save.data || (*err == CURLE_AGAIN)))) {
    drain_tunnel(cf,data,(tunnel_stream *)(puVar1 + 0x12));
  }
  if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0)) &&
      (cf != (Curl_cfilter *)0x0)) && (0 < cf->cft->log_level)) {
    Curl_trc_cf_infof(data,cf,"[%d] cf_recv(len=%zu) -> %zd %d",(ulong)*(uint *)(puVar1 + 0x24),len,
                      save.data,*err);
  }
  *(undefined8 *)((long)cf->ctx + 8) = uVar2;
  return (ssize_t)save.data;
}

Assistant:

static ssize_t cf_h2_proxy_recv(struct Curl_cfilter *cf,
                                struct Curl_easy *data,
                                char *buf, size_t len, CURLcode *err)
{
  struct cf_h2_proxy_ctx *ctx = cf->ctx;
  ssize_t nread = -1;
  struct cf_call_data save;
  CURLcode result;

  if(ctx->tunnel.state != H2_TUNNEL_ESTABLISHED) {
    *err = CURLE_RECV_ERROR;
    return -1;
  }
  CF_DATA_SAVE(save, cf, data);

  if(Curl_bufq_is_empty(&ctx->tunnel.recvbuf)) {
    *err = proxy_h2_progress_ingress(cf, data);
    if(*err)
      goto out;
  }

  nread = tunnel_recv(cf, data, buf, len, err);

  if(nread > 0) {
    CURL_TRC_CF(data, cf, "[%d] increase window by %zd",
                ctx->tunnel.stream_id, nread);
    nghttp2_session_consume(ctx->h2, ctx->tunnel.stream_id, (size_t)nread);
  }

  result = proxy_h2_progress_egress(cf, data);
  if(result == CURLE_AGAIN) {
    /* pending data to send, need to be called again. Ideally, we'd
     * monitor the socket for POLLOUT, but we might not be in SENDING
     * transfer state any longer and are unable to make this happen.
     */
    CURL_TRC_CF(data, cf, "[%d] egress blocked, DRAIN",
                ctx->tunnel.stream_id);
    drain_tunnel(cf, data, &ctx->tunnel);
  }
  else if(result) {
    *err = result;
    nread = -1;
  }

out:
  if(!Curl_bufq_is_empty(&ctx->tunnel.recvbuf) &&
     (nread >= 0 || *err == CURLE_AGAIN)) {
    /* data pending and no fatal error to report. Need to trigger
     * draining to avoid stalling when no socket events happen. */
    drain_tunnel(cf, data, &ctx->tunnel);
  }
  CURL_TRC_CF(data, cf, "[%d] cf_recv(len=%zu) -> %zd %d",
              ctx->tunnel.stream_id, len, nread, *err);
  CF_DATA_RESTORE(cf, save);
  return nread;
}